

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

void __thiscall duckdb::MinMaxStringState::Assign(MinMaxStringState *this,string_t input)

{
  bool bVar1;
  uint uVar2;
  undefined4 uVar3;
  char *pcVar4;
  ulong __n;
  uint uVar5;
  
  uVar5 = input.value._0_4_;
  if (uVar5 < 0xd) {
    if ((((this->super_MinMaxState<duckdb::string_t>).isset == true) &&
        (0xc < (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.length)) &&
       (pcVar4 = (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr,
       pcVar4 != (char *)0x0)) {
      operator_delete__(pcVar4);
    }
    *(ulong *)&(this->super_MinMaxState<duckdb::string_t>).value.value = input.value._0_8_;
    pcVar4 = input.value._8_8_;
  }
  else {
    __n = input.value._0_8_ & 0xffffffff;
    bVar1 = (this->super_MinMaxState<duckdb::string_t>).isset;
    if ((bVar1 == true) &&
       (uVar2 = (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.length,
       uVar5 <= uVar2)) {
      if (uVar2 < 0xd) {
        pcVar4 = (char *)((long)&(this->super_MinMaxState<duckdb::string_t>).value.value + 4);
      }
      else {
        pcVar4 = (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr;
      }
    }
    else {
      if (((bVar1 != false) &&
          (0xc < (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.length)) &&
         (pcVar4 = (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr,
         pcVar4 != (char *)0x0)) {
        operator_delete__(pcVar4);
      }
      pcVar4 = (char *)operator_new__(__n);
    }
    switchD_01602a8a::default(pcVar4,input.value._8_8_,__n);
    uVar3 = *(undefined4 *)pcVar4;
    (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.length = uVar5;
    *(undefined4 *)((long)&(this->super_MinMaxState<duckdb::string_t>).value.value + 4) = uVar3;
  }
  (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr = pcVar4;
  return;
}

Assistant:

void Assign(string_t input) {
		if (input.IsInlined()) {
			// inlined string - we can directly store it into the string_t without having to allocate anything
			Destroy();
			value = input;
		} else {
			// non-inlined string, need to allocate space for it somehow
			auto len = input.GetSize();
			char *ptr;
			if (!isset || value.GetSize() < len) {
				// we cannot fit this into the current slot - destroy it and re-allocate
				Destroy();
				ptr = new char[len];
			} else {
				// this fits into the current slot - take over the pointer
				ptr = value.GetDataWriteable();
			}
			memcpy(ptr, input.GetData(), len);

			value = string_t(ptr, UnsafeNumericCast<uint32_t>(len));
		}
	}